

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhash.c
# Opt level: O2

void rhash_free(rhash ctx)

{
  code *pcVar1;
  rhash_context_ext *ectx;
  rhash prVar2;
  ulong uVar3;
  
  if (ctx != (rhash)0x0) {
    ctx[1].hash_id = 0xdecea5ed;
    prVar2 = ctx + 4;
    for (uVar3 = 0; uVar3 < (uint)ctx[1].msg_size; uVar3 = uVar3 + 1) {
      pcVar1 = *(code **)(*(long *)&prVar2[-1].hash_id + 0x30);
      if (pcVar1 != (code *)0x0) {
        (*pcVar1)(prVar2->msg_size);
      }
      prVar2 = prVar2 + 1;
    }
    free(ctx);
    return;
  }
  return;
}

Assistant:

void rhash_free(rhash ctx)
{
	rhash_context_ext* const ectx = (rhash_context_ext*)ctx;
	unsigned i;

	if (ctx == 0) return;
	ectx->state = STATE_DELETED; /* mark memory block as being removed */

	/* clean the hash functions, which require additional clean up */
	for (i = 0; i < ectx->hash_vector_size; i++) {
		struct rhash_hash_info* info = ectx->vector[i].hash_info;
		if (info->cleanup != 0) {
			info->cleanup(ectx->vector[i].context);
		}
	}
	rhash_aligned_free(ectx);
}